

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_create_scalar_internal(fy_document *fyd,char *data,size_t size,uint flags)

{
  fy_node *fyn_00;
  fy_token *pfVar1;
  bool bVar2;
  bool simple_00;
  fy_node_style local_8c;
  char *local_88;
  char *data_copy;
  undefined1 local_78 [4];
  fy_scalar_style style;
  fy_atom handle;
  fy_input *fyi;
  fy_node *fyn;
  _Bool malloced;
  _Bool copy;
  _Bool simple;
  _Bool alias;
  uint flags_local;
  size_t size_local;
  char *data_local;
  fy_document *fyd_local;
  
  bVar2 = (flags & 1) != 0;
  simple_00 = (flags & 2) != 0;
  local_88 = (char *)0x0;
  if (fyd == (fy_document *)0x0) {
    return (fy_node *)0x0;
  }
  _malloced = size;
  if ((data != (char *)0x0) && (size == 0xffffffffffffffff)) {
    _malloced = strlen(data);
  }
  fyn_00 = fy_node_alloc(fyd,FYNT_SCALAR);
  if (fyn_00 == (fy_node *)0x0) {
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x1257,"fy_node_create_scalar_internal","fy_node_alloc() failed");
  }
  else {
    if ((flags & 4) == 0) {
      if ((flags & 8) == 0) {
        handle._48_8_ = fy_input_from_data(data,_malloced,(fy_atom *)local_78,simple_00);
      }
      else {
        handle._48_8_ = fy_input_from_malloc_data(data,_malloced,(fy_atom *)local_78,simple_00);
      }
    }
    else {
      local_88 = (char *)malloc(_malloced);
      if (local_88 == (char *)0x0) {
        fy_document_diag(fyd,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x125c,"fy_node_create_scalar_internal","malloc() failed");
        goto LAB_0012f675;
      }
      memcpy(local_88,data,_malloced);
      handle._48_8_ = fy_input_from_malloc_data(local_88,_malloced,(fy_atom *)local_78,simple_00);
    }
    if (handle._48_8_ == 0) {
      fy_document_diag(fyd,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x1264,"fy_node_create_scalar_internal","fy_input_from_data() failed");
    }
    else {
      local_88 = (char *)0x0;
      if (bVar2) {
        pfVar1 = fy_token_create(FYTT_ALIAS,local_78);
        (fyn_00->field_12).scalar = pfVar1;
      }
      else {
        data_copy._4_4_ = 2;
        if ((handle.fyi._4_4_ & 0x3f) == 0) {
          data_copy._4_4_ = 0;
        }
        pfVar1 = fy_token_create(FYTT_SCALAR,local_78,(ulong)data_copy._4_4_);
        (fyn_00->field_12).scalar = pfVar1;
      }
      if ((fyn_00->field_12).scalar != (fy_token *)0x0) {
        if (bVar2) {
          local_8c = FYNS_ALIAS;
        }
        else {
          local_8c = FYNS_DOUBLE_QUOTED;
          if (data_copy._4_4_ == 0) {
            local_8c = FYNS_PLAIN;
          }
        }
        fyn_00->style = local_8c;
        fy_input_unref((fy_input *)handle._48_8_);
        return fyn_00;
      }
      fy_document_diag(fyd,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x126e,"fy_node_create_scalar_internal","fy_token_create() failed");
    }
  }
LAB_0012f675:
  if (local_88 != (char *)0x0) {
    free(local_88);
  }
  fy_node_detach_and_free(fyn_00);
  fyd->diag->field_0x3c = fyd->diag->field_0x3c & 0xfe;
  return (fy_node *)0x0;
}

Assistant:

static struct fy_node *
fy_node_create_scalar_internal(struct fy_document *fyd, const char *data, size_t size,
                               unsigned int flags) {
    const bool alias = !!(flags & FYNCSIF_ALIAS);
    const bool simple = !!(flags & FYNCSIF_SIMPLE);
    const bool copy = !!(flags & FYNCSIF_COPY);
    const bool malloced = !!(flags & FYNCSIF_MALLOCED);
    struct fy_node *fyn = NULL;
    struct fy_input *fyi;
    struct fy_atom handle;
    enum fy_scalar_style style;
    char *data_copy = NULL;

    if (!fyd)
        return NULL;

    if (data && size == (size_t) -1)
        size = strlen(data);

    fyn = fy_node_alloc(fyd, FYNT_SCALAR);
    fyd_error_check(fyd, fyn, err_out,
                    "fy_node_alloc() failed");

    if (copy) {
        data_copy = malloc(size);
        fyd_error_check(fyd, data_copy, err_out,
                        "malloc() failed");
        memcpy(data_copy, data, size);
        fyi = fy_input_from_malloc_data(data_copy, size, &handle, simple);
    } else if (malloced)
        fyi = fy_input_from_malloc_data((void *) data, size, &handle, simple);
    else
        fyi = fy_input_from_data(data, size, &handle, simple);
    fyd_error_check(fyd, fyi, err_out,
                    "fy_input_from_data() failed");
    data_copy = NULL;

    if (!alias) {
        style = handle.style == FYAS_PLAIN ? FYSS_PLAIN : FYSS_DOUBLE_QUOTED;
        fyn->scalar = fy_token_create(FYTT_SCALAR, &handle, style);
    } else
        fyn->scalar = fy_token_create(FYTT_ALIAS, &handle);

    fyd_error_check(fyd, fyn->scalar, err_out,
                    "fy_token_create() failed");

    fyn->style = !alias ? (style == FYSS_PLAIN ? FYNS_PLAIN : FYNS_DOUBLE_QUOTED) : FYNS_ALIAS;

    /* take away the input reference */
    fy_input_unref(fyi);

    return fyn;

    err_out:
    if (data_copy)
        free(data_copy);
    fy_node_detach_and_free(fyn);
    fyd->diag->on_error = false;
    return NULL;
}